

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

void ma_dr_mp3_version(ma_uint32 *pMajor,ma_uint32 *pMinor,ma_uint32 *pRevision)

{
  if (pMajor != (ma_uint32 *)0x0) {
    *pMajor = 0;
  }
  if (pMinor != (ma_uint32 *)0x0) {
    *pMinor = 6;
  }
  if (pRevision != (ma_uint32 *)0x0) {
    *pRevision = 0x28;
  }
  return;
}

Assistant:

MA_API void ma_dr_mp3_version(ma_uint32* pMajor, ma_uint32* pMinor, ma_uint32* pRevision)
{
    if (pMajor) {
        *pMajor = MA_DR_MP3_VERSION_MAJOR;
    }
    if (pMinor) {
        *pMinor = MA_DR_MP3_VERSION_MINOR;
    }
    if (pRevision) {
        *pRevision = MA_DR_MP3_VERSION_REVISION;
    }
}